

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall HFSubConsumer::~HFSubConsumer(HFSubConsumer *this)

{
  ConcurrentQueue<_zframe_t_*,_MyTraits> *this_00;
  ConcurrentQueueProducerTypelessBase *pCVar1;
  bool bVar2;
  size_t sVar3;
  size_t i;
  ulong uVar4;
  zframe_t *frame;
  zframe_t *local_30;
  
  (this->super_HighFreqSub)._vptr_HighFreqSub = (_func_int **)&PTR__HFSubConsumer_002fa1b0;
  if (this->req != (zsock_t *)0x0) {
    zsock_destroy_checked
              (&this->req,
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
               ,0xa3);
  }
  this_00 = &this->framequeue;
  uVar4 = 0;
  while( true ) {
    sVar3 = moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::size_approx(this_00);
    if (sVar3 <= uVar4) break;
    bVar2 = moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
                      ((ConcurrentQueue<_zframe_t*,MyTraits> *)this_00,&this->consumetoken,&local_30
                      );
    if (bVar2) {
      zframe_destroy(&local_30);
    }
    uVar4 = uVar4 + 1;
  }
  std::__cxx11::string::~string((string *)&this->rependpoint);
  pCVar1 = (this->ptoken).producer;
  if (pCVar1 != (ConcurrentQueueProducerTypelessBase *)0x0) {
    pCVar1->token = (ProducerToken *)0x0;
    (pCVar1->inactive)._M_base._M_i = true;
  }
  moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::~ConcurrentQueue(this_00);
  HighFreqSub::~HighFreqSub(&this->super_HighFreqSub);
  return;
}

Assistant:

HFSubConsumer::~HFSubConsumer(){
    if(req)
        zsock_destroy(&req);
    for(size_t i = 0; i < framequeue.size_approx(); i++){
        zframe_t* frame;
        if(framequeue.try_dequeue(consumetoken,frame))
            zframe_destroy(&frame);
    }
}